

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackVaryingTestGroup::init
          (TransformFeedbackVaryingTestGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  ContextType type;
  GLSLVersion glslVersion;
  int extraout_EAX;
  TestNode *pTVar2;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(type);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"resource_list","Resource list");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateTransformFeedbackShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateTransformFeedbackResourceListBlockContents);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"array_size","Array size");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateTransformFeedbackShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateTransformFeedbackVariableBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)2>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"name_length","Name length");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateTransformFeedbackShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateTransformFeedbackVariableBlockContents<(deqp::gles31::Functional::ProgramResourcePropFlags)256>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"type","Type");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a35d0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateTransformFeedbackShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateTransformFeedbackVariableTypeBlockContents);
  return extraout_EAX;
}

Assistant:

void TransformFeedbackVaryingTestGroup::init (void)
{
	const glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	// .resource_list
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "resource_list", "Resource list");
		addChild(blockGroup);
		generateTransformFeedbackShaderCaseBlocks(m_context, blockGroup, glslVersion, generateTransformFeedbackResourceListBlockContents);
	}

	// .array_size
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "array_size", "Array size");
		addChild(blockGroup);
		generateTransformFeedbackShaderCaseBlocks(m_context, blockGroup, glslVersion, generateTransformFeedbackVariableBlockContents<PROGRAMRESOURCEPROP_ARRAY_SIZE>);
	}

	// .name_length
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "name_length", "Name length");
		addChild(blockGroup);
		generateTransformFeedbackShaderCaseBlocks(m_context, blockGroup, glslVersion, generateTransformFeedbackVariableBlockContents<PROGRAMRESOURCEPROP_NAME_LENGTH>);
	}

	// .type
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "type", "Type");
		addChild(blockGroup);
		generateTransformFeedbackShaderCaseBlocks(m_context, blockGroup, glslVersion, generateTransformFeedbackVariableTypeBlockContents);
	}
}